

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall gl3cts::TransformFeedback::APIErrors::testInstanced(APIErrors *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 *puVar7;
  uint uVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  bool bVar11;
  GLint max_vertex_streams;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> supported_mode;
  GLenum _supported_mode [12];
  undefined1 local_208 [120];
  ios_base local_190 [264];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_88;
  uint local_58 [6];
  undefined1 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  uint local_28 [2];
  long lVar6;
  
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_38 = 0xd00000004;
  uStack_30 = 0xe0000000c;
  local_58[4] = 0xb;
  local_58[5] = 10;
  puStack_40 = &DAT_600000005;
  local_58[0] = 0;
  local_58[1] = 3;
  local_58[2] = 2;
  local_58[3] = 1;
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::set<unsigned_int*>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_88,
             local_58,local_28);
  p_Var1 = &local_88._M_impl.super__Rb_tree_header;
  p_Var9 = &p_Var1->_M_header;
  p_Var2 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar3 = 0;
  do {
    for (; uVar8 = uVar3, (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[bVar11]) {
      bVar11 = (uint)*(size_t *)(p_Var2 + 1) < uVar8;
      if (!bVar11) {
        p_Var9 = p_Var2;
      }
      uVar3 = uVar8;
    }
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var9,
       uVar8 < (uint)((_Rb_tree_header *)p_Var9)->_M_node_count)) {
      p_Var10 = p_Var1;
    }
    p_Var9 = &p_Var1->_M_header;
    p_Var2 = local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
    uVar3 = uVar8 + 1;
  } while (p_Var10 != p_Var1);
  (**(code **)(lVar6 + 0x5b8))(uVar8,this->m_transform_feedback_object_0,1);
  iVar4 = (**(code **)(lVar6 + 0x800))();
  if (iVar4 == 0x500) {
    (**(code **)(lVar6 + 0x5c8))(uVar8,this->m_transform_feedback_object_0,0,1);
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 == 0x500) {
      (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindTransformFeedback call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x586);
      (**(code **)(lVar6 + 0x1680))(this->m_program_id_with_geometry_shader);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x58a);
      (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindVertexArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x58e);
      (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_buffer_0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBindBuffer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x592);
      (**(code **)(lVar6 + 0x30))(0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glBeginTransformFeedback call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x596);
      (**(code **)(lVar6 + 0x538))(0,0,1);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glDrawArrays call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x59a);
      (**(code **)(lVar6 + 0x638))();
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glEndTransformFeedback call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0x59e);
      (**(code **)(lVar6 + 0x5b8))(1,this->m_transform_feedback_object_0,1);
      iVar4 = (**(code **)(lVar6 + 0x800))();
      if (iVar4 == 0x502) {
        (**(code **)(lVar6 + 0x5c8))(1,this->m_transform_feedback_object_0,0,1);
        iVar4 = (**(code **)(lVar6 + 0x800))();
        if (iVar4 == 0x502) {
          (**(code **)(lVar6 + 0xd0))(0x8e22,this->m_transform_feedback_object_0);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glBindTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5bb);
          (**(code **)(lVar6 + 0x1680))(this->m_program_id_with_tessellation_shaders);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glUseProgram call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5bf);
          (**(code **)(lVar6 + 0xd8))(this->m_vertex_array_object);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glBindVertexArray call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5c3);
          (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_buffer_0);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glBindBuffer call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5c7);
          (**(code **)(lVar6 + 0x30))(1);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glBeginTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5cb);
          (**(code **)(lVar6 + 0x538))(0xe,0,2);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glDrawArrays call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5cf);
          (**(code **)(lVar6 + 0x638))();
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glEndTransformFeedback call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                          ,0x5d3);
          (**(code **)(lVar6 + 0x5b8))(0,this->m_transform_feedback_object_0,1);
          iVar4 = (**(code **)(lVar6 + 0x800))();
          if (iVar4 == 0x502) {
            (**(code **)(lVar6 + 0x5c8))(0,this->m_transform_feedback_object_0,0,1);
            iVar4 = (**(code **)(lVar6 + 0x800))();
            if (iVar4 == 0x502) {
              (**(code **)(lVar6 + 0x868))(0x8e71);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glGetIntegerv call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                              ,0x5f2);
              puVar7 = (undefined4 *)__cxa_allocate_exception(4);
              *puVar7 = 0;
              __cxa_throw(puVar7,&int::typeinfo,0);
            }
            local_208._0_8_ = this->m_context->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_208 + 8),
                       "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                       ,0x97);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            local_208._0_8_ = this->m_context->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_208 + 8),
                       "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                       ,0x97);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
        }
        else {
          local_208._0_8_ = this->m_context->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_208 + 8),
                     "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                     ,0x97);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        local_208._0_8_ = this->m_context->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_208 + 8),
                   "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
                   ,0x97);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_208._0_8_ = this->m_context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_208 + 8),
                 "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced when <mode> was invalid."
                 ,0x82);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_208._0_8_ = this->m_context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_208 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_208 + 8),
               "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and DrawTransformFeedbackStreamInstanced when <mode> was invalid."
               ,0x82);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_208,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_208 + 8));
  std::ios_base::~ios_base(local_190);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_88);
  return false;
}

Assistant:

bool gl3cts::TransformFeedback::APIErrors::testInstanced(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/*  INVALID_ENUM is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <mode> is invalid */

	glw::GLenum _supported_mode[] = { GL_POINTS,
									  GL_LINE_STRIP,
									  GL_LINE_LOOP,
									  GL_LINES,
									  GL_LINE_STRIP_ADJACENCY,
									  GL_LINES_ADJACENCY,
									  GL_TRIANGLE_STRIP,
									  GL_TRIANGLE_FAN,
									  GL_TRIANGLES,
									  GL_TRIANGLE_STRIP_ADJACENCY,
									  GL_TRIANGLES_ADJACENCY,
									  GL_PATCHES };

	std::set<glw::GLenum> supported_mode(_supported_mode,
										 _supported_mode + sizeof(_supported_mode) / sizeof(_supported_mode[0]));

	int mode = 0;

	while (supported_mode.find(mode) != supported_mode.end())
	{
		mode++;
	}

	gl.drawTransformFeedbackInstanced(mode, m_transform_feedback_object_0, 1);

	if (GL_INVALID_ENUM != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and "
											   "DrawTransformFeedbackStreamInstanced when <mode> was invalid."
											<< tcu::TestLog::EndMessage;
		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(mode, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_ENUM != gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "INVALID_ENUM was not generated by DrawTransformFeedbackInstanced and "
											   "DrawTransformFeedbackStreamInstanced when <mode> was invalid."
											<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_OPERATION is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <mode> does not match geometry
	 shader */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.useProgram(m_program_id_with_geometry_shader);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vertex_array_object);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.beginTransformFeedback(GL_POINTS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	gl.drawTransformFeedbackInstanced(GL_LINES, m_transform_feedback_object_0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_LINES, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_OPERATION is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <mode> does not match tessellation */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.useProgram(m_program_id_with_tessellation_shaders);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vertex_array_object);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.beginTransformFeedback(GL_LINES);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_PATCHES, 0, 2);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	gl.drawTransformFeedbackInstanced(GL_POINTS, m_transform_feedback_object_0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_POINTS, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_VALUE is generated by DrawTransformFeedbackStreamInstanced if
	 <stream> is greater than or equal to MAX_VERTEX_STREAMS */

	glw::GLint max_vertex_streams = 0;

	gl.getIntegerv(GL_MAX_VERTEX_STREAMS, &max_vertex_streams);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

	if (max_vertex_streams == 0)
	{
		/* Failed to query GL_MAX_VERTEX_STREAMS. */
		throw 0;
	}

	glw::GLint more_than_max_vertex_streams = max_vertex_streams + 1;

	gl.drawTransformFeedbackStreamInstanced(GL_PATCHES, m_transform_feedback_object_0, more_than_max_vertex_streams, 1);

	if (GL_INVALID_VALUE != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;
		return false;
	}

	/*  INVALID_VALUE is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if <id> is not name of transform
	 feedback object */

	unsigned short int invalid_name = 1;

	while (gl.isTransformFeedback(invalid_name))
	{
		++invalid_name;

		/* Make sure that this loop ends someday, bad day. */
		if (invalid_name == USHRT_MAX)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Cannot find unused trnasform feedback object." << tcu::TestLog::EndMessage;
			throw 0;
		}
	}

	gl.drawTransformFeedbackInstanced(GL_PATCHES, (glw::GLuint)invalid_name, 1);

	if (GL_INVALID_VALUE != gl.getError())
	{
		gl.endTransformFeedback();

		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_PATCHES, (glw::GLuint)invalid_name, 0, 1);

	if (GL_INVALID_VALUE != gl.getError())
	{
		gl.endTransformFeedback();

		return false;
	}

	/*  INVALID_OPERATION is generated by DrawTransformFeedbackInstanced and
	 DrawTransformFeedbackStreamInstanced if a non-zero buffer object name is
	 bound to an enabled array and the buffer object's data store is currently
	 mapped */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.useProgram(m_program_id_with_input_output);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vertex_array_object);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	glw::GLint location = gl.getAttribLocation(m_program_id_with_input_output, (glw::GLchar*)"v_input");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetAttribLocation call failed.");

	if (location < 0)
	{
		throw 0;
	}

	gl.vertexAttribPointer(location, 1, GL_FLOAT, GL_FALSE, 0, NULL);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribLPointer call failed.");

	gl.enableVertexAttribArray(0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase call failed.");

	gl.beginTransformFeedback(GL_POINTS);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	glw::GLvoid* pointer UNUSED = gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	gl.drawTransformFeedbackInstanced(GL_POINTS, m_transform_feedback_object_0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		gl.disableVertexAttribArray(location);

		return false;
	}

	gl.drawTransformFeedbackStreamInstanced(GL_POINTS, m_transform_feedback_object_0, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		gl.disableVertexAttribArray(location);

		return false;
	}

	gl.unmapBuffer(GL_ARRAY_BUFFER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	pointer = DE_NULL;

	gl.disableVertexAttribArray(location);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisableVertexAttribArray call failed.");

	/*  INVALID_OPERATION is generated if by DrawTransformFeedbackStreamInstanced
	 if EndTransformFeedback was never called for the object named <id>.
	 return true */

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transform_feedback_object_1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.drawTransformFeedbackStreamInstanced(GL_PATCHES, m_transform_feedback_object_1, 0, 1);

	if (GL_INVALID_OPERATION != gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "INVALID_OPERATION was not generated by DrawTransformFeedbackInstanced and "
										"DrawTransformFeedbackStreamInstanced if <mode> did not match geometry shader."
			<< tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		gl.disableVertexAttribArray(location);

		return false;
	}

	return true;
}